

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Template_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::Iter<false>::fastForward(Iter<false> *this)

{
  ulong uVar1;
  NodePtr pDVar2;
  ulong *puVar3;
  ulong uVar4;
  
  pDVar2 = this->mKeyVals;
  puVar3 = (ulong *)this->mInfo;
  while (uVar4 = *puVar3, uVar4 == 0) {
    puVar3 = puVar3 + 1;
    this->mInfo = (uint8_t *)puVar3;
    pDVar2 = pDVar2 + 8;
    this->mKeyVals = pDVar2;
  }
  uVar1 = 0;
  if (uVar4 != 0) {
    for (; (uVar4 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
    }
  }
  uVar4 = uVar1 >> 3 & 0x1fffffff;
  this->mInfo = (uint8_t *)((long)puVar3 + uVar4);
  this->mKeyVals = pDVar2 + uVar4;
  return;
}

Assistant:

void fastForward() noexcept {
            size_t n = 0;
            while (0U == (n = detail::unaligned_load<size_t>(mInfo))) {
                mInfo += sizeof(size_t);
                mKeyVals += sizeof(size_t);
            }
#if defined(ROBIN_HOOD_DISABLE_INTRINSICS)
            // we know for certain that within the next 8 bytes we'll find a non-zero one.
            if (ROBIN_HOOD_UNLIKELY(0U == detail::unaligned_load<uint32_t>(mInfo))) {
                mInfo += 4;
                mKeyVals += 4;
            }
            if (ROBIN_HOOD_UNLIKELY(0U == detail::unaligned_load<uint16_t>(mInfo))) {
                mInfo += 2;
                mKeyVals += 2;
            }
            if (ROBIN_HOOD_UNLIKELY(0U == *mInfo)) {
                mInfo += 1;
                mKeyVals += 1;
            }
#else
#    if ROBIN_HOOD(LITTLE_ENDIAN)
            auto inc = ROBIN_HOOD_COUNT_TRAILING_ZEROES(n) / 8;
#    else
            auto inc = ROBIN_HOOD_COUNT_LEADING_ZEROES(n) / 8;
#    endif
            mInfo += inc;
            mKeyVals += inc;
#endif
        }